

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

uint8_t __thiscall
icu_63::Normalizer2Impl::getPreviousTrailCC(Normalizer2Impl *this,UChar *start,UChar *p)

{
  uint16_t uVar1;
  int iVar2;
  uint c;
  
  if (start != p) {
    c = (uint)(ushort)start[((long)p - (long)start) * 0x80000000 + -0x100000000 >> 0x20];
    iVar2 = (int)((ulong)((long)p - (long)start) >> 1);
    if (1 < iVar2 && (c & 0xfc00) == 0xdc00) {
      if ((start[iVar2 - 2] & 0xfc00U) == 0xd800) {
        c = (uint)(ushort)start[((long)p - (long)start) * 0x80000000 + -0x100000000 >> 0x20] +
            (uint)(ushort)start[iVar2 - 2] * 0x400 + 0xfca02400;
      }
    }
    uVar1 = getFCD16(this,c);
    return (uint8_t)uVar1;
  }
  return '\0';
}

Assistant:

uint8_t Normalizer2Impl::getPreviousTrailCC(const UChar *start, const UChar *p) const {
    if (start == p) {
        return 0;
    }
    int32_t i = (int32_t)(p - start);
    UChar32 c;
    U16_PREV(start, 0, i, c);
    return (uint8_t)getFCD16(c);
}